

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

string * nonius::detail::escape
                   (string *source,
                   unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *escapes)

{
  bool bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  pointer pvVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDX;
  string *in_RDI;
  const_iterator it;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  next_magic;
  difference_type n_magic;
  const_iterator last;
  const_iterator first;
  string magic;
  string *escaped;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea0;
  _Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  in_stack_fffffffffffffea8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  _Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_100;
  _Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  char *local_e0;
  char *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 local_a1;
  string *local_a0;
  undefined8 local_98;
  char *local_90;
  difference_type local_88;
  undefined8 local_80;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  _Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_58;
  _Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_50;
  string local_38 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  
  local_18 = in_RDX;
  std::__cxx11::string::string(local_38);
  std::
  unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::size((unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x1f55eb);
  std::__cxx11::string::reserve((ulong)local_38);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin((unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffe98);
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffe98);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::back_inserter<std::__cxx11::string>(in_stack_fffffffffffffe98);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             transform<std::__detail::_Node_const_iterator<std::pair<char_const,std::__cxx11::string>,false,false>,std::back_insert_iterator<std::__cxx11::string>,nonius::detail::escape(std::__cxx11::string_const&,std::unordered_map<char,std::__cxx11::string,std::hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::__cxx11::string>>>const&)::_lambda(std::pair<char_const,std::__cxx11::string>const&)_1_>
                       (local_50._M_cur,local_58._M_cur,local_60);
  local_78._M_current = (char *)std::__cxx11::string::begin();
  local_98 = std::__cxx11::string::end();
  local_90 = local_78._M_current;
  local_a0 = local_38;
  local_80 = local_98;
  local_88 = std::
             count_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,nonius::detail::escape(std::__cxx11::string_const&,std::unordered_map<char,std::__cxx11::string,std::hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::__cxx11::string>>>const&)::_lambda(char)_1_>
                       (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                        (anon_class_8_1_a84798cd_for__M_pred)in_stack_fffffffffffffeb0._M_current);
  local_a1 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffea0._M_current,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffe98), bVar1) {
    local_b8 = local_78._M_current;
    local_c0 = local_80;
    __last._M_current = (char *)local_38;
    local_c8 = std::__cxx11::string::begin();
    local_d0 = std::__cxx11::string::end();
    __first = std::
              find_first_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                        (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )in_stack_fffffffffffffea8._M_cur,in_stack_fffffffffffffea0);
    local_d8 = local_78._M_current;
    local_e0 = __first._M_current;
    local_b0 = __first._M_current;
    in_stack_fffffffffffffeb8._M_current =
         (char *)std::back_inserter<std::__cxx11::string>(in_stack_fffffffffffffe98);
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffeb8._M_current;
    in_stack_fffffffffffffeb0._M_current =
         (char *)std::
                 copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
                           (__first,__last,
                            (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )in_stack_fffffffffffffeb8._M_current);
    local_78._M_current = local_b0;
    local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffeb0._M_current;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffea0._M_current,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffe98);
    if (bVar1) {
      in_stack_fffffffffffffea0._M_current = (char *)local_18;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_78);
      in_stack_fffffffffffffea8._M_cur =
           (__node_type *)
           std::
           unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffe98,(key_type *)0x1f58a2);
      local_f8._M_cur = in_stack_fffffffffffffea8._M_cur;
      local_100._M_cur =
           (__node_type *)
           std::
           unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffe98);
      bVar1 = std::__detail::operator!=(&local_f8,&local_100);
      if (bVar1) {
        pvVar2 = std::__detail::
                 _Node_const_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                 ::operator->((_Node_const_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                               *)0x1f58e4);
        std::__cxx11::string::operator+=((string *)in_RDI,(string *)&pvVar2->second);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_78);
    }
  }
  local_a1 = 1;
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

inline std::string escape(std::string const& source, std::unordered_map<char, std::string> const& escapes) {
            std::string magic;
            magic.reserve(escapes.size());
            std::transform(escapes.begin(), escapes.end(), std::back_inserter(magic), [](std::pair<char const, std::string> const& p) { return p.first; });

            auto first = source.begin();
            auto last = source.end();

            auto n_magic = std::count_if(first, last, [&magic](char c) { return magic.find(c) != std::string::npos; });

            std::string escaped;
            escaped.reserve(source.size() + n_magic*6);

            while(first != last) {
                auto next_magic = std::find_first_of(first, last, magic.begin(), magic.end());
                std::copy(first, next_magic, std::back_inserter(escaped));
                first = next_magic;
                if(first != last) {
                    auto it = escapes.find(*first);
                    if(it != escapes.end()) {
                        escaped += it->second;
                    }
                    ++first;
                }
            }
            return escaped;
        }